

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::EagerPromiseNodeBase::fire(EagerPromiseNodeBase *this)

{
  Event *extraout_RDX;
  long in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar1;
  NullableValue<kj::Exception> _exception3102;
  NullableValue<kj::Exception> local_4d8;
  NullableValue<kj::Exception> local_340;
  
  (**(code **)(**(long **)(in_RSI + 0x50) + 0x18))
            (*(long **)(in_RSI + 0x50),*(undefined8 *)(in_RSI + 0x60));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0x50));
  local_4d8.isSet = false;
  NullableValue<kj::Exception>::NullableValue(&local_340,&local_4d8);
  NullableValue<kj::Exception>::~NullableValue(&local_4d8);
  if (local_340.isSet == true) {
    ExceptionOrValue::addException(*(ExceptionOrValue **)(in_RSI + 0x60),&local_340.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_340);
  PromiseNode::OnReadyEvent::arm((OnReadyEvent *)(in_RSI + 0x58));
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<Event>> EagerPromiseNodeBase::fire() {
  dependency->get(resultRef);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    dependency = nullptr;
  })) {
    resultRef.addException(kj::mv(exception));
  }

  onReadyEvent.arm();
  return kj::none;
}